

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  float *pfVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int *piVar9;
  ConvolutionDepthWise3D *pCVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  int iVar22;
  int iVar23;
  size_type __n;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  uint _h;
  ulong uVar32;
  Mat *pMVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int outd;
  int outh;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_1e8;
  allocator_type local_1d9;
  size_t local_1d8;
  ulong local_1d0;
  void *local_1c8;
  Mat *local_1c0;
  ulong local_1b8;
  void *local_1b0;
  void *local_1a8;
  ConvolutionDepthWise3D *local_1a0;
  void *local_198;
  float *local_190;
  long local_188;
  size_t local_180;
  ulong local_178;
  void *local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  long local_140;
  ulong local_138;
  int local_12c;
  undefined1 local_128 [16];
  void *local_110;
  Mat local_108;
  undefined1 local_b8 [16];
  long local_a8;
  void *local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  uVar14 = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  iVar29 = this->kernel_w;
  iVar30 = this->kernel_h;
  iVar17 = this->dilation_w;
  iVar16 = this->dilation_h;
  iVar2 = this->kernel_d;
  iVar22 = this->dilation_d;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar32._0_1_ = opt->use_bf16_storage;
  uVar32._1_1_ = opt->use_fp16_packed;
  uVar32._2_1_ = opt->use_fp16_storage;
  uVar32._3_1_ = opt->use_fp16_arithmetic;
  uVar32._4_1_ = opt->use_int8_packed;
  uVar32._5_1_ = opt->use_int8_storage;
  uVar32._6_1_ = opt->use_int8_arithmetic;
  uVar32._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_reserved_6 = opt->use_reserved_6;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar32 & 0xffffffffffffff;
  local_1a0 = this;
  make_padding(this,bottom_blob,&local_108,&local_78);
  iVar11 = local_108.h;
  pCVar10 = local_1a0;
  iVar23 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    local_1c8 = (void *)CONCAT44(local_1c8._4_4_,local_108.w);
    uVar32 = (long)(~((iVar29 + -1) * iVar17) + local_108.w) / (long)local_1a0->stride_w;
    uVar19 = (long)(~((iVar30 + -1) * iVar16) + local_108.h) / (long)local_1a0->stride_h;
    uVar26 = (long)(~((iVar2 + -1) * iVar22) + local_108.d) / (long)local_1a0->stride_d;
    uVar13 = local_1a0->kernel_w * local_1a0->kernel_h * local_1a0->kernel_d;
    __n = (size_type)(int)uVar13;
    local_1c0 = top_blob;
    local_180 = sVar4;
    local_178 = (ulong)uVar14;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__n,&local_1d9);
    piVar12 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar33 = local_1c0;
    uVar14 = (int)uVar32 + 1;
    _h = (int)uVar19 + 1;
    iVar29 = pCVar10->kernel_d;
    if (0 < iVar29) {
      iVar30 = pCVar10->dilation_h;
      iVar17 = pCVar10->kernel_w;
      iVar24 = pCVar10->dilation_w * iVar17;
      iVar16 = pCVar10->kernel_h;
      iVar22 = iVar30 * iVar16;
      iVar2 = pCVar10->dilation_d;
      iVar23 = 0;
      iVar25 = 0;
      iVar27 = 0;
      do {
        if (0 < iVar16) {
          iVar29 = 0;
          do {
            if (0 < iVar17) {
              lVar28 = 0;
              do {
                local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar23 + lVar28] = iVar25;
                iVar25 = iVar25 + pCVar10->dilation_w;
                iVar17 = pCVar10->kernel_w;
                lVar28 = lVar28 + 1;
              } while ((int)lVar28 < iVar17);
              iVar23 = iVar23 + (int)lVar28;
              iVar16 = pCVar10->kernel_h;
            }
            iVar25 = iVar25 + (iVar30 * (int)local_1c8 - iVar24);
            iVar29 = iVar29 + 1;
          } while (iVar29 < iVar16);
          iVar29 = pCVar10->kernel_d;
        }
        iVar25 = iVar25 + (iVar11 * iVar2 - iVar22) * (int)local_1c8;
        iVar27 = iVar27 + 1;
      } while (iVar27 < iVar29);
    }
    local_1d0 = uVar26 & 0xffffffff;
    local_190 = (float *)(uVar32 & 0xffffffff);
    local_168 = uVar19 & 0xffffffff;
    Mat::create(local_1c0,uVar14,_h,(int)uVar26 + 1,pCVar10->num_output,local_180,
                opt->blob_allocator);
    auVar40 = local_b8;
    local_110 = pMVar33->data;
    iVar23 = -100;
    if ((local_110 != (void *)0x0) &&
       (local_1d8 = pMVar33->cstep, (long)pMVar33->c * local_1d8 != 0)) {
      uVar3 = pCVar10->group;
      uVar15 = (uint)local_178;
      if (uVar3 == pCVar10->num_output && uVar15 == uVar3) {
        if (0 < (int)uVar15) {
          local_1d8 = local_1d8 * pMVar33->elemsize;
          pvVar20 = (pCVar10->weight_data).data;
          local_1b0 = local_108.data;
          local_1b8 = local_108.cstep *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_170 = (void *)((long)local_108.w *
                              CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
          local_140 = (long)local_108.h * (long)local_170;
          local_158 = (ulong)(int)uVar14;
          local_b8._4_4_ = 0;
          local_b8._0_4_ = _h;
          local_b8._8_8_ = auVar40._8_8_;
          uVar19 = (ulong)uVar14;
          uVar26 = 0;
          uVar32 = local_1d0;
          local_150 = uVar19;
          do {
            if (-1 < (int)uVar32) {
              local_1a8 = (void *)(local_1b8 * uVar26 + (long)local_1b0);
              pvVar21 = (void *)(local_1d8 * uVar26 + (long)local_110);
              uVar18 = 0;
              local_148 = uVar26;
              do {
                local_138 = uVar18;
                if (-1 < (int)local_168) {
                  iVar29 = local_1a0->bias_term;
                  iVar30 = local_1a0->activation_type;
                  local_198 = (void *)((long)(int)uVar18 * (long)local_1a0->stride_d * local_140 +
                                      (long)local_1a8);
                  local_180 = (size_t)local_1a0->stride_w;
                  local_160 = (long)local_1a0->stride_h * (long)local_170;
                  local_188 = 0;
                  local_1c8 = (void *)CONCAT44(local_1c8._4_4_,iVar29);
                  do {
                    if (-1 < (int)local_190) {
                      pfVar5 = (float *)(local_1a0->activation_params).data;
                      pvVar6 = (local_1a0->bias_data).data;
                      local_1c0 = (Mat *)(local_188 * local_160 + (long)local_198);
                      uVar32 = 0;
                      do {
                        if (iVar29 == 0) {
                          auVar37 = ZEXT812(0);
                        }
                        else {
                          auVar37._4_8_ = 0;
                          auVar37._0_4_ = *(uint *)((long)pvVar6 + uVar26 * 4);
                        }
                        auVar39._12_4_ = 0;
                        auVar39._0_12_ = auVar37;
                        if (0 < (int)uVar13) {
                          uVar18 = 0;
                          do {
                            auVar39._0_4_ =
                                 auVar39._0_4_ +
                                 *(float *)((long)pvVar20 + uVar18 * 4) *
                                 *(float *)((long)&local_1c0->data +
                                           (long)piVar12[uVar18] * 4 + uVar32 * local_180 * 4);
                            uVar18 = uVar18 + 1;
                          } while (uVar13 != uVar18);
                        }
                        fVar34 = auVar39._0_4_;
                        switch(iVar30) {
                        case 1:
                          if (fVar34 <= 0.0) {
                            auVar7._12_4_ = 0;
                            auVar7._0_12_ = auVar39._4_12_;
                            auVar39 = auVar7 << 0x20;
                          }
                        default:
switchD_00508c1a_default:
                          fVar35 = auVar39._0_4_;
                          break;
                        case 2:
                          fVar35 = (float)(~-(uint)(0.0 < fVar34) & (uint)*pfVar5 |
                                          -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                          break;
                        case 3:
                          if (fVar34 <= *pfVar5) {
                            auVar39._0_4_ = *pfVar5;
                          }
                          fVar35 = pfVar5[1];
                          if (auVar39._0_4_ <= fVar35) {
                            fVar35 = auVar39._0_4_;
                          }
                          break;
                        case 4:
                          if (88.37626 <= fVar34) {
                            fVar34 = 88.37626;
                          }
                          fVar34 = expf((float)(-(uint)(fVar34 < -88.37626) & 0x42b0c0a5 |
                                               ~-(uint)(fVar34 < -88.37626) & (uint)-fVar34));
                          uVar19 = local_150;
                          uVar26 = local_148;
                          iVar29 = (int)local_1c8;
                          fVar35 = 1.0 / (fVar34 + 1.0);
                          break;
                        case 5:
                          local_128 = auVar39;
                          fVar34 = expf(fVar34);
                          fVar34 = logf(fVar34 + 1.0);
                          fVar34 = tanhf(fVar34);
                          uVar19 = local_150;
                          uVar26 = local_148;
                          iVar29 = (int)local_1c8;
                          fVar35 = fVar34 * (float)local_128._0_4_;
                          break;
                        case 6:
                          fVar1 = *pfVar5;
                          fVar36 = -pfVar5[1] / fVar1;
                          fVar35 = 0.0;
                          if (fVar36 <= fVar34) {
                            if (fVar36 + 1.0 / fVar1 < fVar34) goto switchD_00508c1a_default;
                            fVar35 = (fVar1 * fVar34 + pfVar5[1]) * fVar34;
                          }
                        }
                        *(float *)((long)pvVar21 + uVar32 * 4) = fVar35;
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar19);
                    }
                    pvVar21 = (void *)((long)pvVar21 + local_158 * 4);
                    local_188 = local_188 + 1;
                  } while (local_188 != local_b8._0_8_);
                }
                uVar18 = (ulong)((int)local_138 + 1);
                uVar32 = local_1d0;
              } while ((int)local_138 != (int)local_1d0);
            }
            uVar26 = uVar26 + 1;
            pvVar20 = (void *)((long)pvVar20 + __n * 4);
          } while (uVar26 != local_178);
        }
      }
      else {
        uVar32 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | local_178 & 0xffffffff) /
                 (long)(int)uVar3;
        if (0 < (int)uVar3) {
          uVar26 = uVar32 & 0xffffffff;
          uVar19 = (long)pCVar10->num_output / (long)(int)uVar3;
          local_170 = (void *)(uVar19 & 0xffffffff);
          local_1d8 = local_1d8 * pMVar33->elemsize;
          local_a0 = (pCVar10->weight_data).data;
          iVar29 = (int)uVar32 * uVar13;
          local_1c0 = (Mat *)(ulong)(uint)pMVar33->w;
          local_160 = CONCAT44(local_160._4_4_,pMVar33->h);
          local_168 = CONCAT44(local_168._4_4_,pMVar33->d);
          local_138 = (ulong)pMVar33->w;
          local_12c = (int)uVar19;
          local_a8 = (long)local_12c;
          local_12c = local_12c * iVar29;
          local_140 = (long)iVar29 << 2;
          local_1b0 = (void *)0x0;
          local_1b8 = 0;
          local_158 = CONCAT44(local_158._4_4_,(int)uVar32);
          local_98 = (ulong)uVar3;
          do {
            if (0 < (int)local_170) {
              local_128._0_8_ = (void *)((long)local_a0 + (long)(int)local_1b0 * 4);
              local_178 = local_1b8 * local_a8;
              iVar30 = (int)uVar26;
              iVar29 = (int)local_1b8;
              local_1a8 = (void *)0x0;
              do {
                if (0 < (int)local_168) {
                  local_188 = (long)local_1a8 + local_178;
                  local_1e8 = (void *)(local_1d8 * local_188 + (long)local_110);
                  local_1d0 = local_1d0 & 0xffffffff00000000;
                  do {
                    if (0 < (int)local_160) {
                      local_180 = CONCAT44(local_180._4_4_,local_1a0->bias_term);
                      iVar17 = local_1a0->activation_type;
                      local_198 = (void *)((ulong)local_198 & 0xffffffff00000000);
                      do {
                        if (0 < (int)local_1c0) {
                          local_190 = (float *)(local_1a0->activation_params).data;
                          local_1c8 = (local_1a0->bias_data).data;
                          lVar28 = (long)local_108.w *
                                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize)
                          ;
                          lVar31 = local_108.cstep *
                                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize)
                          ;
                          local_148 = (long)local_108.data +
                                      (long)(int)local_198 * (long)local_1a0->stride_h * lVar28 +
                                      local_108.h * lVar28 *
                                      (long)(int)local_1d0 * (long)local_1a0->stride_d;
                          local_150 = (ulong)local_1a0->stride_w;
                          pMVar33 = (Mat *)0x0;
                          do {
                            if ((int)local_180 == 0) {
                              auVar38 = ZEXT812(0);
                            }
                            else {
                              auVar38._4_8_ = 0;
                              auVar38._0_4_ = *(uint *)((long)local_1c8 + local_188 * 4);
                            }
                            auVar40._12_4_ = 0;
                            auVar40._0_12_ = auVar38;
                            if (0 < (int)uVar26) {
                              uVar19 = 0;
                              lVar28 = local_128._0_8_;
                              do {
                                if (0 < (int)uVar13) {
                                  uVar18 = 0;
                                  do {
                                    auVar40._0_4_ =
                                         auVar40._0_4_ +
                                         *(float *)(lVar28 + uVar18 * 4) *
                                         *(float *)(local_148 +
                                                   (long)piVar12[uVar18] * 4 +
                                                   (uVar19 + (uint)(iVar30 * iVar29)) * lVar31 +
                                                   (long)pMVar33 * local_150 * 4);
                                    uVar18 = uVar18 + 1;
                                  } while (uVar13 != uVar18);
                                }
                                uVar19 = uVar19 + 1;
                                lVar28 = lVar28 + __n * 4;
                              } while (uVar19 != (uVar32 & 0xffffffff));
                            }
                            fVar34 = auVar40._0_4_;
                            switch(iVar17) {
                            case 1:
                              if (fVar34 <= 0.0) {
                                auVar8._12_4_ = 0;
                                auVar8._0_12_ = auVar40._4_12_;
                                auVar40 = auVar8 << 0x20;
                              }
                            default:
switchD_005090bc_default:
                              fVar35 = auVar40._0_4_;
                              break;
                            case 2:
                              fVar35 = (float)(~-(uint)(0.0 < fVar34) & (uint)*local_190 |
                                              -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                              break;
                            case 3:
                              if (fVar34 <= *local_190) {
                                auVar40._0_4_ = *local_190;
                              }
                              fVar35 = local_190[1];
                              if (auVar40._0_4_ <= fVar35) {
                                fVar35 = auVar40._0_4_;
                              }
                              break;
                            case 4:
                              if (88.37626 <= fVar34) {
                                fVar34 = 88.37626;
                              }
                              fVar34 = expf((float)(-(uint)(fVar34 < -88.37626) & 0x42b0c0a5 |
                                                   ~-(uint)(fVar34 < -88.37626) & (uint)-fVar34));
                              uVar26 = local_158 & 0xffffffff;
                              fVar35 = 1.0 / (fVar34 + 1.0);
                              break;
                            case 5:
                              local_b8 = auVar40;
                              fVar34 = expf(fVar34);
                              fVar34 = logf(fVar34 + 1.0);
                              fVar34 = tanhf(fVar34);
                              uVar26 = local_158 & 0xffffffff;
                              fVar35 = fVar34 * (float)local_b8._0_4_;
                              break;
                            case 6:
                              fVar1 = *local_190;
                              fVar36 = -local_190[1] / fVar1;
                              fVar35 = 0.0;
                              if (fVar36 <= fVar34) {
                                if (fVar36 + 1.0 / fVar1 < fVar34) goto switchD_005090bc_default;
                                fVar35 = (fVar1 * fVar34 + local_190[1]) * fVar34;
                              }
                            }
                            *(float *)((long)local_1e8 + (long)pMVar33 * 4) = fVar35;
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar33 != local_1c0);
                        }
                        local_1e8 = (void *)((long)local_1e8 + local_138 * 4);
                        iVar16 = (int)local_198 + 1;
                        local_198 = (void *)CONCAT44(local_198._4_4_,iVar16);
                      } while (iVar16 != (int)local_160);
                    }
                    iVar17 = (int)local_1d0 + 1;
                    local_1d0 = CONCAT44(local_1d0._4_4_,iVar17);
                  } while (iVar17 != (int)local_168);
                }
                local_1a8 = (void *)((long)local_1a8 + 1);
                local_128._0_8_ = local_128._0_8_ + local_140;
              } while (local_1a8 != local_170);
            }
            local_1b8 = local_1b8 + 1;
            local_1b0 = (void *)(ulong)(uint)((int)local_1b0 + local_12c);
          } while (local_1b8 != local_98);
        }
      }
      iVar23 = 0;
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar9 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}